

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_avx512::destroy_pipeline(Convolution_x86_avx512 *this)

{
  Option *in_stack_00000018;
  Convolution_x86_avx512 *in_stack_00000020;
  
  destroy_pipeline(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

int Convolution_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (convolution_dilation1)
    {
        convolution_dilation1->destroy_pipeline(opt);
        delete convolution_dilation1;
        convolution_dilation1 = 0;
    }

    return 0;
}